

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketData.h
# Opt level: O3

void __thiscall
uWS::WebSocketData::WebSocketData
          (WebSocketData *this,bool perMessageDeflate,int compressOptions,string *backpressure)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  DeflationStream *this_00;
  
  paVar1 = &(this->super_AsyncSocketData<false>).buffer.field_2;
  (this->super_AsyncSocketData<false>).buffer._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (backpressure->_M_dataplus)._M_p;
  paVar2 = &backpressure->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&backpressure->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->super_AsyncSocketData<false>).buffer.field_2 + 8) = uVar4;
  }
  else {
    (this->super_AsyncSocketData<false>).buffer._M_dataplus._M_p = pcVar3;
    (this->super_AsyncSocketData<false>).buffer.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->super_AsyncSocketData<false>).buffer._M_string_length = backpressure->_M_string_length;
  (backpressure->_M_dataplus)._M_p = (pointer)paVar2;
  backpressure->_M_string_length = 0;
  (backpressure->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->super_WebSocketState<true>).state = 0;
  *(undefined8 *)((this->super_WebSocketState<true>).state.spill + 7) = 0;
  (this->super_WebSocketState<true>).remainingBytes = 0;
  (this->super_WebSocketState<true>).mask[0] = '\0';
  (this->super_WebSocketState<true>).mask[1] = '\0';
  (this->super_WebSocketState<true>).mask[2] = '\0';
  (this->super_WebSocketState<true>).mask[3] = '\0';
  *(undefined1 *)&(this->super_WebSocketState<true>).state = 0xe1;
  (this->fragmentBuffer)._M_dataplus._M_p = (pointer)&(this->fragmentBuffer).field_2;
  (this->fragmentBuffer)._M_string_length = 0;
  (this->fragmentBuffer).field_2._M_local_buf[0] = '\0';
  this->controlTipLength = 0;
  this->isShuttingDown = false;
  this->deflationStream = (DeflationStream *)0x0;
  this->subscriber = (Subscriber *)0x0;
  this->compressionStatus = perMessageDeflate;
  if ((compressOptions & 2U) != 0 && perMessageDeflate) {
    this_00 = (DeflationStream *)operator_new(0x70);
    DeflationStream::DeflationStream(this_00,compressOptions);
    this->deflationStream = this_00;
  }
  return;
}

Assistant:

WebSocketData(bool perMessageDeflate, int compressOptions, std::string &&backpressure) : AsyncSocketData<false>(std::move(backpressure)), WebSocketState<true>() {
        compressionStatus = perMessageDeflate ? ENABLED : DISABLED;

        /* Initialize the dedicated sliding window */
        if (perMessageDeflate && (compressOptions & CompressOptions::DEDICATED_COMPRESSOR)) {
            deflationStream = new DeflationStream(compressOptions);
        }
    }